

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::Set<(wabt::ExprType)24>
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,
          VarExpr<(wabt::ExprType)24> *ve)

{
  string *psVar1;
  char *in_R8;
  string_view sVar2;
  string_view x;
  string_view local_40;
  
  psVar1 = Var::name_abi_cxx11_(&ve->var);
  sVar2.data_ = (psVar1->_M_dataplus)._M_p;
  sVar2.size_ = psVar1->_M_string_length;
  sVar2 = VarName(this,sVar2);
  x.data_ = (char *)sVar2.size_;
  x.size_ = (size_type)" = ";
  operator+[abi_cxx11_((string *)&local_40,(wabt *)sVar2.data_,x,in_R8);
  WrapChild(__return_storage_ptr__,this,child,local_40,(string_view)ZEXT816(0x1a19c1),Assign);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Value Set(Value& child, const VarExpr<T>& ve) {
    return WrapChild(child, VarName(ve.var.name()) + " = ", "", Precedence::Assign);
  }